

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pla.h
# Opt level: O0

int Pla_CubesAreDistance1(word *p,word *q,int nWords)

{
  int iVar1;
  int local_38;
  int local_34;
  int fFound;
  int c;
  word Test;
  int nWords_local;
  word *q_local;
  word *p_local;
  
  local_38 = 0;
  local_34 = 0;
  do {
    if (nWords <= local_34) {
      return local_38;
    }
    if (p[local_34] != q[local_34]) {
      if (local_38 != 0) {
        return 0;
      }
      iVar1 = Pla_OnlyOneOne((p[local_34] ^ q[local_34] | (p[local_34] ^ q[local_34]) >> 1) &
                             0x5555555555555555);
      if (iVar1 == 0) {
        return 0;
      }
      local_38 = 1;
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

static inline int Pla_CubesAreDistance1( word * p, word * q, int nWords )
{
    word Test; int c, fFound = 0;
    for ( c = 0; c < nWords; c++ )
    {
        if ( p[c] == q[c] )
            continue;
        if ( fFound )
            return 0;
        // check if the number of 1s is one, which means exactly one different literal (0/1, -/1, -/0)
        Test = ((p[c] ^ q[c]) | ((p[c] ^ q[c]) >> 1)) & MASK55;
        if ( !Pla_OnlyOneOne(Test) )
            return 0;
        fFound = 1;
    }
    return fFound;
}